

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

int mi_reserve_huge_os_pages_interleave(size_t pages,size_t numa_nodes,size_t timeout_msecs)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t timeout_msecs_00;
  ulong uVar5;
  ulong pages_00;
  bool bVar6;
  
  if (pages == 0) {
    return 0;
  }
  if (numa_nodes == 0) {
    numa_nodes = _mi_os_numa_node_count();
  }
  uVar5 = numa_nodes + (numa_nodes == 0);
  uVar2 = pages / uVar5;
  uVar3 = pages % uVar5;
  timeout_msecs_00 = 0;
  if (timeout_msecs != 0) {
    timeout_msecs_00 = timeout_msecs / uVar5 + 0x32;
  }
  uVar4 = 0;
  while ((uVar4 < uVar5 && (pages != 0))) {
    pages_00 = uVar2 + (uVar4 < uVar3);
    iVar1 = mi_reserve_huge_os_pages_at(pages_00,(int)uVar4,timeout_msecs_00);
    if (iVar1 != 0) {
      return iVar1;
    }
    bVar6 = pages < pages_00;
    pages = pages - pages_00;
    if (bVar6) {
      pages = 0;
    }
    uVar4 = uVar4 + 1;
  }
  return 0;
}

Assistant:

int mi_reserve_huge_os_pages_interleave(size_t pages, size_t numa_nodes, size_t timeout_msecs) mi_attr_noexcept {
  if (pages == 0) return 0;

  // pages per numa node
  size_t numa_count = (numa_nodes > 0 ? numa_nodes : _mi_os_numa_node_count());
  if (numa_count <= 0) numa_count = 1;
  const size_t pages_per = pages / numa_count;
  const size_t pages_mod = pages % numa_count;
  const size_t timeout_per = (timeout_msecs==0 ? 0 : (timeout_msecs / numa_count) + 50);

  // reserve evenly among numa nodes
  for (size_t numa_node = 0; numa_node < numa_count && pages > 0; numa_node++) {
    size_t node_pages = pages_per;  // can be 0
    if (numa_node < pages_mod) node_pages++;
    int err = mi_reserve_huge_os_pages_at(node_pages, (int)numa_node, timeout_per);
    if (err) return err;
    if (pages < node_pages) {
      pages = 0;
    }
    else {
      pages -= node_pages;
    }
  }

  return 0;
}